

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_block_queue.h
# Opt level: O2

FuncCallInfo * __thiscall
cppnet::ThreadSafeBlockQueue<FuncCallInfo_*>::Pop(ThreadSafeBlockQueue<FuncCallInfo_*> *this)

{
  FuncCallInfo *pFVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->_mutex);
  std::_V2::condition_variable_any::
  wait<std::mutex,cppnet::ThreadSafeBlockQueue<FuncCallInfo*>::Pop()::_lambda()_1_>
            (&this->_empty_notify,&this->_mutex,(anon_class_8_1_8991fb9c)this);
  pFVar1 = *(this->_queue).c.super__Deque_base<FuncCallInfo_*,_std::allocator<FuncCallInfo_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  std::deque<FuncCallInfo_*,_std::allocator<FuncCallInfo_*>_>::pop_front(&(this->_queue).c);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return pFVar1;
}

Assistant:

T Pop() {
        std::unique_lock<std::mutex> lock(_mutex);
        _empty_notify.wait(_mutex, [this]() {return !this->_queue.empty(); });

        auto ret = std::move(_queue.front());
        _queue.pop();
 
        return ret;
    }